

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O1

void Gia_ManHashProfile(Gia_Man_t *p)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  printf("Table size = %d. Entries = %d. ",(ulong)(uint)p->nHTable,
         (ulong)(uint)(~(p->vCos->nSize + p->vCis->nSize) + p->nObjs));
  printf("Hits = %d. Misses = %d.\n",(ulong)(uint)p->nHashHit,(ulong)(uint)p->nHashMiss);
  uVar1 = p->nHTable;
  if (0 < (int)uVar1) {
    uVar5 = 1000;
    if ((int)uVar1 < 1000) {
      uVar5 = (ulong)uVar1;
    }
    uVar4 = 0;
    do {
      uVar1 = p->pHTable[uVar4];
      if (uVar1 == 0) {
        pGVar2 = (Gia_Obj_t *)0x0;
      }
      else {
        if ((int)uVar1 < 0) {
LAB_006b1c1a:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x10c,"int Abc_Lit2Var(int)");
        }
        if (p->nObjs <= (int)(uVar1 >> 1)) {
LAB_006b1c39:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pGVar2 = p->pObjs + (uVar1 >> 1);
      }
      iVar3 = 0;
      while (pGVar2 != (Gia_Obj_t *)0x0) {
        uVar1 = pGVar2->Value;
        if (uVar1 == 0) {
          pGVar2 = (Gia_Obj_t *)0x0;
        }
        else {
          if ((int)uVar1 < 0) goto LAB_006b1c1a;
          if (p->nObjs <= (int)(uVar1 >> 1)) goto LAB_006b1c39;
          pGVar2 = p->pObjs + (uVar1 >> 1);
        }
        iVar3 = iVar3 + 1;
      }
      if (iVar3 != 0) {
        printf("%d ");
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar5);
  }
  putchar(10);
  return;
}

Assistant:

void Gia_ManHashProfile( Gia_Man_t * p )
{
    Gia_Obj_t * pEntry;
    int i, Counter, Limit;
    printf( "Table size = %d. Entries = %d. ", p->nHTable, Gia_ManAndNum(p) );
    printf( "Hits = %d. Misses = %d.\n", (int)p->nHashHit, (int)p->nHashMiss );
    Limit = Abc_MinInt( 1000, p->nHTable );
    for ( i = 0; i < Limit; i++ )
    {
        Counter = 0;
        for ( pEntry = (p->pHTable[i]? Gia_ManObj(p, Abc_Lit2Var(p->pHTable[i])) : NULL); 
              pEntry; 
              pEntry = (pEntry->Value? Gia_ManObj(p, Abc_Lit2Var(pEntry->Value)) : NULL) )
            Counter++;
        if ( Counter ) 
            printf( "%d ", Counter );
    }
    printf( "\n" );
}